

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O1

Abc_Cex_t * Saig_ManCexRemap(Aig_Man_t *p,Aig_Man_t *pAbs,Abc_Cex_t *pCexAbs)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  int iVar3;
  Abc_Cex_t *p_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  
  iVar3 = Saig_ManVerifyCex(pAbs,pCexAbs);
  if (iVar3 == 0) {
    puts("Saig_ManCexRemap(): The initial counter-example is invalid.");
  }
  p_00 = Abc_CexAlloc(p->nRegs,p->nTruePis,pCexAbs->iFrame + 1);
  p_00->iFrame = pCexAbs->iFrame;
  p_00->iPo = pCexAbs->iPo;
  if (-1 < pCexAbs->iFrame) {
    iVar3 = 0;
    do {
      if (0 < pAbs->nTruePis) {
        pVVar1 = pAbs->vCis;
        iVar6 = 0;
        do {
          if (pVVar1->nSize <= iVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (iVar6 == p->nTruePis) break;
          uVar4 = pCexAbs->nPis * iVar3 + pCexAbs->nRegs + iVar6;
          if (((uint)(&pCexAbs[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
            iVar5 = p_00->nPis * iVar3 + p_00->nRegs + iVar6;
            (&p_00[1].iPo)[iVar5 >> 5] = (&p_00[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < pAbs->nTruePis);
      }
      bVar2 = iVar3 < pCexAbs->iFrame;
      iVar3 = iVar3 + 1;
    } while (bVar2);
  }
  pAVar7 = p;
  iVar3 = Saig_ManVerifyCex(p,p_00);
  iVar6 = (int)pAVar7;
  if (iVar3 == 0) {
    puts("Saig_ManCexRemap(): Counter-example is invalid.");
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  else {
    Abc_Print(iVar6,"Counter-example verification is successful.\n");
    Abc_Print(iVar6,"Output %d of miter \"%s\" was asserted in frame %d. \n",(ulong)(uint)p_00->iPo,
              p->pName,(ulong)(uint)p_00->iFrame);
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Saig_ManCexRemap( Aig_Man_t * p, Aig_Man_t * pAbs, Abc_Cex_t * pCexAbs )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    int i, f;
    if ( !Saig_ManVerifyCex( pAbs, pCexAbs ) )
        printf( "Saig_ManCexRemap(): The initial counter-example is invalid.\n" );
//    else
//        printf( "Saig_ManCexRemap(): The initial counter-example is correct.\n" );
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p), Saig_ManPiNum(p), pCexAbs->iFrame+1 );
    pCex->iFrame = pCexAbs->iFrame;
    pCex->iPo    = pCexAbs->iPo;
    // copy the bit data
    for ( f = 0; f <= pCexAbs->iFrame; f++ )
    {
        Saig_ManForEachPi( pAbs, pObj, i )
        {
            if ( i == Saig_ManPiNum(p) )
                break;
            if ( Abc_InfoHasBit( pCexAbs->pData, pCexAbs->nRegs + pCexAbs->nPis * f + i ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p, pCex ) )
    {
        printf( "Saig_ManCexRemap(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    else
    {
        Abc_Print( 1, "Counter-example verification is successful.\n" );
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. \n", pCex->iPo, p->pName, pCex->iFrame );
    }
    return pCex;
}